

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O3

uint __thiscall o3dgc::Arithmetic_Codec::decode(Arithmetic_Codec *this,Static_Bit_Model *M)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *pbVar5;
  bool bVar6;
  
  uVar1 = this->value;
  uVar3 = (this->length >> 0xd) * M->bit_0_prob;
  uVar2 = uVar1;
  uVar4 = uVar3;
  if (uVar3 <= uVar1) {
    this->value = uVar1 - uVar3;
    uVar4 = this->length - uVar3;
    uVar2 = uVar1 - uVar3;
  }
  this->length = uVar4;
  if (uVar4 < 0x1000000) {
    pbVar5 = this->ac_pointer;
    do {
      pbVar5 = pbVar5 + 1;
      this->ac_pointer = pbVar5;
      uVar2 = uVar2 << 8 | (uint)*pbVar5;
      this->value = uVar2;
      this->length = uVar4 << 8;
      bVar6 = uVar4 < 0x10000;
      uVar4 = uVar4 << 8;
    } while (bVar6);
  }
  return (uint)(uVar3 <= uVar1);
}

Assistant:

unsigned Arithmetic_Codec::decode(Static_Bit_Model & M)
    {
    #ifdef _DEBUG
      if (mode != 2) AC_Error("decoder not initialized");
    #endif

      unsigned x = M.bit_0_prob * (length >> BM__LengthShift);   // product l x p0
      unsigned bit = (value >= x);                                     // decision
                                                        // update & shift interval
      if (bit == 0)
        length  = x;
      else {
        value  -= x;                                 // shifted interval base = 0
        length -= x;
      }

      if (length < AC__MinLength) renorm_dec_interval();        // renormalization

      return bit;                                         // return data bit value
    }